

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

double __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::LogFunc::precision
          (LogFunc *this,EvalContext *ctx,double ret,double x)

{
  Precision PVar1;
  double dVar2;
  int iStack_8;
  
  if (x <= 0.0) {
    return NAN;
  }
  PVar1 = ctx->floatPrecision;
  if (PVar1 != PRECISION_LOWP) {
    if (PVar1 != PRECISION_MEDIUMP) {
      if (PVar1 != PRECISION_HIGHP) {
        return 0.0;
      }
      if ((0.5 <= x) && (x <= 2.0)) {
        iStack_8 = -0x15;
        goto LAB_0069b284;
      }
      dVar2 = 3.0;
      goto LAB_0069b29c;
    }
    if ((0.5 <= x) && (x <= 2.0)) {
      iStack_8 = -7;
LAB_0069b284:
      dVar2 = ldexp(1.0,iStack_8);
      return dVar2;
    }
  }
  dVar2 = 2.0;
LAB_0069b29c:
  dVar2 = tcu::FloatFormat::ulp(&ctx->format,ret,dVar2);
  return dVar2;
}

Assistant:

double		precision	(const EvalContext& ctx, double ret, double x) const
	{
		if (x <= 0)
			return TCU_NAN;

		switch (ctx.floatPrecision)
		{
			case glu::PRECISION_HIGHP:
				return (0.5 <= x && x <= 2.0) ? deLdExp(1.0, -21) : ctx.format.ulp(ret, 3.0);
			case glu::PRECISION_MEDIUMP:
				return (0.5 <= x && x <= 2.0) ? deLdExp(1.0, -7) : ctx.format.ulp(ret, 2.0);
			case glu::PRECISION_LOWP:
				return ctx.format.ulp(ret, 2.0);
			default:
				DE_FATAL("Impossible");
		}

		return 0;
	}